

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchAndBound.cpp
# Opt level: O3

bool __thiscall
tsbp::LeftmostActiveOnly::IsFixedSequence(LeftmostActiveOnly *this,Node *node,size_t nextItemId)

{
  ulong uVar1;
  int iVar2;
  long lVar3;
  size_type sVar4;
  int *piVar5;
  ulong uVar6;
  bool bVar7;
  initializer_list<unsigned_long> __l;
  vector<unsigned_long,_std::allocator<unsigned_long>_> fixedSequence;
  allocator_type local_c9;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_c8;
  unsigned_long local_b0 [17];
  
  sVar4 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::count
                    (&((node->Packing)._M_t.
                       super___uniq_ptr_impl<tsbp::Packing2D,_std::default_delete<tsbp::Packing2D>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_tsbp::Packing2D_*,_std::default_delete<tsbp::Packing2D>_>
                       .super__Head_base<0UL,_tsbp::Packing2D_*,_false>._M_head_impl)->PlacedItems);
  memcpy(local_b0,&DAT_001399d0,0x88);
  __l._M_len = 0x11;
  __l._M_array = local_b0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_c8,__l,&local_c9);
  if (sVar4 == 0) {
LAB_001211fd:
    if (nextItemId == 0xffffffffffffffff) {
      bVar7 = true;
      if (local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start == (pointer)0x0) {
        return true;
      }
    }
    else {
      bVar7 = local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[sVar4] == nextItemId;
    }
  }
  else {
    lVar3 = *(long *)&(((node->Packing)._M_t.
                        super___uniq_ptr_impl<tsbp::Packing2D,_std::default_delete<tsbp::Packing2D>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_tsbp::Packing2D_*,_std::default_delete<tsbp::Packing2D>_>
                        .super__Head_base<0UL,_tsbp::Packing2D_*,_false>._M_head_impl)->Items).
                      super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>._M_impl;
    if (*local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start == (long)*(int *)(lVar3 + 0x10)) {
      piVar5 = (int *)(lVar3 + 0x30);
      uVar6 = 0;
      do {
        if (sVar4 - 1 == uVar6) goto LAB_001211fd;
        iVar2 = *piVar5;
        piVar5 = piVar5 + 8;
        uVar1 = uVar6 + 1;
        lVar3 = uVar6 + 1;
        uVar6 = uVar1;
      } while (local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[lVar3] == (long)iVar2);
      bVar7 = sVar4 <= uVar1;
    }
    else {
      bVar7 = false;
    }
  }
  operator_delete(local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start,
                  (long)local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                  (long)local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start);
  return bVar7;
}

Assistant:

bool LeftmostActiveOnly::IsFixedSequence(const Node& node, size_t nextItemId)
{
    const auto& packing = node.Packing;
    size_t currentItemId = node.ItemIdToPlace;

    size_t numberOfPlacedItems = node.PlacedItems().count();

    std::vector<size_t> fixedSequence = {0, 10, 5, 9, 14, 11, 2, 4, 7, 3, 6, 16, 12, 1, 15, 17, 13};

    const auto& placedItems = node.Packing->Items;
    for (size_t i = 0; i < numberOfPlacedItems; i++)
    {
        const Rectangle& placedItem = placedItems[i];

        size_t itemIdToPlace = fixedSequence[i];

        if (placedItem.InternId != itemIdToPlace)
        {
            return false;
        }
    }

    if (nextItemId == -1)
    {
        return true;
    }

    size_t nextItemIdToPlace = fixedSequence[numberOfPlacedItems];
    if (nextItemIdToPlace != nextItemId)
    {
        return false;
    }

    return true;
}